

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolact.cpp
# Opt level: O1

void qsort_descent_inplace(vector<Object,_std::allocator<Object>_> *objects,int left,int right)

{
  float fVar1;
  pointer pOVar2;
  pointer pOVar3;
  Object *pOVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int right_00;
  Object *__b;
  pointer __a;
  int iVar8;
  
  do {
    right_00 = right;
    iVar8 = left;
    if (left <= right) {
      fVar1 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
              super__Vector_impl_data._M_start[(right + left) / 2].prob;
      do {
        pOVar2 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar6 = (long)iVar8 + -1;
        __a = pOVar2 + (long)iVar8 + -1;
        iVar5 = iVar8;
        do {
          iVar8 = iVar5;
          pOVar3 = __a + 1;
          lVar6 = lVar6 + 1;
          __a = __a + 1;
          iVar5 = iVar8 + 1;
        } while (fVar1 < pOVar3->prob);
        lVar7 = (long)right_00 + 1;
        __b = pOVar2 + (long)right_00 + 1;
        iVar5 = right_00;
        do {
          right_00 = iVar5;
          lVar7 = lVar7 + -1;
          pOVar4 = __b + -1;
          __b = __b + -1;
          iVar5 = right_00 + -1;
        } while (pOVar4->prob <= fVar1 && fVar1 != pOVar4->prob);
        if (lVar6 <= lVar7) {
          std::swap<Object>(__a,__b);
          right_00 = right_00 + -1;
          iVar8 = iVar8 + 1;
        }
      } while (iVar8 <= right_00);
    }
    if (left < right_00) {
      qsort_descent_inplace(objects,left,right_00);
    }
    left = iVar8;
  } while (iVar8 < right);
  return;
}

Assistant:

static void qsort_descent_inplace(std::vector<Object>& objects, int left, int right)
{
    int i = left;
    int j = right;
    float p = objects[(left + right) / 2].prob;

    while (i <= j)
    {
        while (objects[i].prob > p)
            i++;

        while (objects[j].prob < p)
            j--;

        if (i <= j)
        {
            // swap
            std::swap(objects[i], objects[j]);

            i++;
            j--;
        }
    }

    #pragma omp parallel sections
    {
        #pragma omp section
        {
            if (left < j) qsort_descent_inplace(objects, left, j);
        }
        #pragma omp section
        {
            if (i < right) qsort_descent_inplace(objects, i, right);
        }
    }
}